

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.h
# Opt level: O0

CFL_ALLOWED_TYPE store_cfl_required(AV1_COMMON *cm,MACROBLOCKD *xd)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  MB_MODE_INFO *mbmi;
  bool local_21;
  MB_MODE_INFO *mbmi_00;
  bool local_1;
  
  mbmi_00 = (MB_MODE_INFO *)**(undefined8 **)(in_RSI + 0x1eb8);
  if (*(char *)(*(long *)(in_RDI + 0x6088) + 0x4d) == '\0') {
    if ((*(byte *)(in_RSI + 0xc) & 1) == 0) {
      local_1 = true;
    }
    else {
      iVar1 = is_inter_block(mbmi_00);
      local_21 = false;
      if (iVar1 == 0) {
        local_21 = mbmi_00->uv_mode == '\r';
      }
      local_1 = local_21;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static inline CFL_ALLOWED_TYPE store_cfl_required(const AV1_COMMON *cm,
                                                  const MACROBLOCKD *xd) {
  const MB_MODE_INFO *mbmi = xd->mi[0];

  if (cm->seq_params->monochrome) return CFL_DISALLOWED;

  if (!xd->is_chroma_ref) {
    // For non-chroma-reference blocks, we should always store the luma pixels,
    // in case the corresponding chroma-reference block uses CfL.
    // Note that this can only happen for block sizes which are <8 on
    // their shortest side, as otherwise they would be chroma reference
    // blocks.
    return CFL_ALLOWED;
  }

  // If this block has chroma information, we know whether we're
  // actually going to perform a CfL prediction
  return (CFL_ALLOWED_TYPE)(!is_inter_block(mbmi) &&
                            mbmi->uv_mode == UV_CFL_PRED);
}